

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O2

CTxMemPool * __thiscall miner_tests::MinerTestingSetup::MakeMempool(MinerTestingSetup *this)

{
  long lVar1;
  _Head_base<0UL,_CTxMemPool_*,_false> _Var2;
  undefined1 __p [8];
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *this_00;
  long in_FS_OFFSET;
  undefined1 local_d0 [8];
  Options local_c8;
  bilingual_str error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
             mempool;
  std::__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>::reset
            ((__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00,(pointer)0x0);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  MemPoolOptionsForTest
            ((Options *)(local_d0 + 8),
             &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node);
  std::make_unique<CTxMemPool,kernel::MemPoolOptions,bilingual_str&>
            ((MemPoolOptions *)local_d0,(bilingual_str *)(local_d0 + 8));
  __p = local_d0;
  local_d0 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>::reset
            ((__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00,(pointer)__p);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::~unique_ptr
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)local_d0);
  local_c8.check_ratio._0_1_ = error.original._M_string_length == 0;
  inline_assertion_check<true,bool>
            ((bool *)(local_d0 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x36,"MakeMempool","error.empty()");
  _Var2._M_head_impl =
       (this_00->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
       super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
       super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  bilingual_str::~bilingual_str(&error);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var2._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool& MakeMempool()
    {
        // Delete the previous mempool to ensure with valgrind that the old
        // pointer is not accessed, when the new one should be accessed
        // instead.
        m_node.mempool.reset();
        bilingual_str error;
        m_node.mempool = std::make_unique<CTxMemPool>(MemPoolOptionsForTest(m_node), error);
        Assert(error.empty());
        return *m_node.mempool;
    }